

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O0

Soundex * __thiscall Soundex::encode(Soundex *this,string *word)

{
  Soundex local_38 [8];
  string encoded;
  string *word_local;
  
  encodeString(local_38,word);
  resize(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

string Soundex::encode(const string &word) {
    string encoded = encodeString(word);
    return resize(encoded);
}